

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

void __thiscall
nuraft::buffer_serializer::put_bytes(buffer_serializer *this,void *raw_ptr,size_t len)

{
  bool bVar1;
  overflow_error *this_00;
  void *in_RDX;
  buffer_serializer *in_RSI;
  size_t in_RDI;
  buffer_serializer *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  bVar1 = is_valid(in_stack_ffffffffffffffd8,in_RDI);
  if (!bVar1) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  put_u32(in_RSI,(uint32_t)((ulong)in_RDX >> 0x20));
  put_raw(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void buffer_serializer::put_bytes(const void* raw_ptr, size_t len) {
    if ( !is_valid(len + sizeof(uint32_t)) ) {
        throw std::overflow_error("not enough space");
    }
    put_u32(len);
    put_raw(raw_ptr, len);
}